

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsChaseCamera.cpp
# Opt level: O1

void __thiscall
chrono::utils::ChChaseCamera::Initialize
          (ChChaseCamera *this,ChVector<double> *ptOnChassis,ChCoordsys<double> *driverCoordsys,
          double chaseDist,double chaseHeight,ChVector<double> *up,ChVector<double> *fwd)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  element_type *peVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  int iVar13;
  undefined4 extraout_var;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  long lVar14;
  
  if (&this->m_ptOnChassis != ptOnChassis) {
    (this->m_ptOnChassis).m_data[0] = ptOnChassis->m_data[0];
    (this->m_ptOnChassis).m_data[1] = ptOnChassis->m_data[1];
    (this->m_ptOnChassis).m_data[2] = ptOnChassis->m_data[2];
  }
  if (&this->m_driverCsys != driverCoordsys) {
    (this->m_driverCsys).pos.m_data[0] = (driverCoordsys->pos).m_data[0];
    (this->m_driverCsys).pos.m_data[1] = (driverCoordsys->pos).m_data[1];
    (this->m_driverCsys).pos.m_data[2] = (driverCoordsys->pos).m_data[2];
    (this->m_driverCsys).rot.m_data[0] = (driverCoordsys->rot).m_data[0];
    (this->m_driverCsys).rot.m_data[1] = (driverCoordsys->rot).m_data[1];
    (this->m_driverCsys).rot.m_data[2] = (driverCoordsys->rot).m_data[2];
    (this->m_driverCsys).rot.m_data[3] = (driverCoordsys->rot).m_data[3];
  }
  this->m_dist = chaseDist;
  this->m_height = chaseHeight;
  this->m_angle = 0.0;
  if (&this->m_up != up) {
    (this->m_up).m_data[0] = up->m_data[0];
    (this->m_up).m_data[1] = up->m_data[1];
    (this->m_up).m_data[2] = up->m_data[2];
  }
  if (&this->m_fwd != fwd) {
    (this->m_fwd).m_data[0] = fwd->m_data[0];
    (this->m_fwd).m_data[1] = fwd->m_data[1];
    (this->m_fwd).m_data[2] = fwd->m_data[2];
  }
  peVar7 = (this->m_chassis).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar7 != (element_type *)0x0) {
    iVar13 = (*(peVar7->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x3e])();
    lVar14 = CONCAT44(extraout_var,iVar13);
    dVar8 = chaseHeight + (this->m_ptOnChassis).m_data[2];
    dVar12 = (this->m_ptOnChassis).m_data[0] - chaseDist;
    dVar9 = (this->m_ptOnChassis).m_data[1] + 0.0;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *(ulong *)(lVar14 + 0x70);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = dVar12;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = dVar9 * *(double *)(lVar14 + 0x78);
    auVar1 = vfmadd231sd_fma(auVar20,auVar15,auVar1);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *(ulong *)(lVar14 + 0x80);
    auVar17._8_8_ = 0;
    auVar17._0_8_ = dVar8;
    auVar1 = vfmadd231sd_fma(auVar1,auVar17,auVar2);
    dVar10 = auVar1._0_8_ + *(double *)(lVar14 + 0x18);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = *(ulong *)(lVar14 + 0x58);
    auVar21._8_8_ = 0;
    auVar21._0_8_ = dVar9 * *(double *)(lVar14 + 0x60);
    auVar1 = vfmadd231sd_fma(auVar21,auVar15,auVar3);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = *(ulong *)(lVar14 + 0x68);
    auVar1 = vfmadd231sd_fma(auVar1,auVar17,auVar4);
    dVar11 = auVar1._0_8_ + *(double *)(lVar14 + 0x10);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = *(ulong *)(lVar14 + 0x40);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = dVar12;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = dVar9 * *(double *)(lVar14 + 0x48);
    auVar1 = vfmadd231sd_fma(auVar19,auVar16,auVar5);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = *(ulong *)(lVar14 + 0x50);
    auVar18._8_8_ = 0;
    auVar18._0_8_ = dVar8;
    auVar1 = vfmadd231sd_fma(auVar1,auVar18,auVar6);
    dVar8 = auVar1._0_8_ + *(double *)(lVar14 + 8);
    (this->m_loc).m_data[0] = dVar8;
    (this->m_loc).m_data[1] = dVar11;
    (this->m_loc).m_data[2] = dVar10;
    (this->m_lastLoc).m_data[0] = dVar8;
    (this->m_lastLoc).m_data[1] = dVar11;
    (this->m_lastLoc).m_data[2] = dVar10;
  }
  return;
}

Assistant:

void ChChaseCamera::Initialize(const ChVector<>& ptOnChassis,
                               const ChCoordsys<>& driverCoordsys,
                               double chaseDist,
                               double chaseHeight,
                               const ChVector<>& up,
                               const ChVector<>& fwd) {
    m_ptOnChassis = ptOnChassis;
    m_driverCsys = driverCoordsys;
    m_dist = chaseDist;
    m_height = chaseHeight;
    m_angle = 0;

    m_up = up;
    m_fwd = fwd;

    if (m_chassis) {
        ChVector<> localOffset(-m_dist, 0, m_height);
        m_loc = m_chassis->GetFrame_REF_to_abs().TransformPointLocalToParent(m_ptOnChassis + localOffset);
        m_lastLoc = m_loc;
    }
}